

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void Node_Copy(node *p,node *Src,array *Dup)

{
  long *plVar1;
  nodeclass *Class_00;
  ulong Type_00;
  void *pvVar2;
  nodeexpr *expr;
  datatype Type;
  uint8_t Data [256];
  nodeclass *Class;
  nodedata *i;
  array *Dup_local;
  node *Src_local;
  node *p_local;
  
  plVar1 = (long *)p->VMT;
  Class_00 = (nodeclass *)(plVar1 + -9);
  if (Class_00 == (nodeclass *)((long)Src->VMT + -0x48)) {
    for (Class = (nodeclass *)Src->Data; Class != (nodeclass *)0x0; Class = *(nodeclass **)Class) {
      Type_00 = (ulong)Class->Meta & 0x3f;
      if ((((Type_00 == 0x1f) || (Type_00 == 0x20)) || (Type_00 == 0x1b)) &&
         ((pvVar2 = Node_AddData(p,(ulong)Class->Meta >> 8,Type_00,&Class->Module), Type_00 == 0x1b
          && (pvVar2 != (void *)0x0)))) {
        (**(code **)(*plVar1 + 0xb8))(p,pvVar2,Dup);
      }
    }
    CopyData(Class_00,p,Src,Dup,&Type);
  }
  return;
}

Assistant:

void Node_Copy(node* p, node* Src, array* Dup)
{
    nodedata* i;
    const nodeclass* Class = NodeGetClass(p);
    uint8_t Data[MAXDATA];

    // at moment only same ClassId will be copied
    if (Class != NodeGetClass(Src))
        return;

    for (i=Src->Data;i;i=i->Next)
    {
        datatype Type = i->Code & TYPE_MASK;
        if (Type == TYPE_EXPRSTRING || Type == TYPE_EXPRPARAM || Type == TYPE_EXPR)
        {
            nodeexpr* expr = Node_AddData(p,(dataid)(i->Code>>8),Type,NodeData_Data(i));
            if (Type == TYPE_EXPR && expr)
                NodeClass_Context(Class)->ExprDup(p,expr,Dup);
        }
    }

    CopyData(Class,p,Src,Dup,Data);
}